

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined1 auStack_a8 [8];
  nn_options_t options;
  int sock;
  char **argv_local;
  int argc_local;
  
  options.data_to_send.data = (char *)0x0;
  options.data_to_send.length = 0;
  options.data_to_send.need_free = 0;
  options.send_delay = 0.0;
  options.send_interval = 0.0;
  options.subscriptions.to_free = (char **)0x0;
  options.subscriptions.num = 0;
  options.subscriptions.to_free_num = 0;
  options.send_timeout = 0.0;
  options.recv_timeout = 0.0;
  options.subscriptions.items = (char **)0x0;
  options.connect_addresses.to_free = (char **)0x0;
  options.bind_addresses.num = 0;
  options.bind_addresses.to_free_num = 0;
  options.connect_addresses.items = (char **)0x0;
  options.bind_addresses.items = (char **)0x0;
  options.bind_addresses.to_free = (char **)0x0;
  auStack_a8._0_4_ = 0;
  auStack_a8._4_4_ = 0;
  options.verbose = 0;
  options.socket_type = 0;
  options.connect_addresses.num = -0x40800000;
  options.connect_addresses.to_free_num = -0x40800000;
  options.socket_name = (char *)0xbf80000000000000;
  nn_parse_options(&nn_cli,(nn_options_t *)auStack_a8,argc,argv);
  iVar1 = nn_create_socket((nn_options_t *)auStack_a8);
  nn_connect_socket((nn_options_t *)auStack_a8,iVar1);
  nn_sleep((int)(options.socket_name._0_4_ * 1000.0));
  if (auStack_a8._4_4_ - 0x10 < 0x61) {
    iVar1 = (*(code *)(&DAT_00107020 +
                      *(int *)(&DAT_00107020 + (ulong)(auStack_a8._4_4_ - 0x10) * 4)))();
    return iVar1;
  }
  nn_close(iVar1);
  nn_free_options(&nn_cli,auStack_a8);
  return 0;
}

Assistant:

int main (int argc, char **argv)
{
    int sock;
    nn_options_t options = {
        /* verbose           */ 0,
        /* socket_type       */ 0,
        /* bind_addresses    */ {NULL, NULL, 0, 0},
        /* connect_addresses */ {NULL, NULL, 0, 0},
        /* send_timeout      */ -1.f,
        /* recv_timeout      */ -1.f,
        /* subscriptions     */ {NULL, NULL, 0, 0},
        /* socket_name       */ NULL,
        /* send_delay        */ 0.f,
        /* send_interval     */ -1.f,
        /* data_to_send      */ {NULL, 0, 0},
        /* echo_format       */ NN_NO_ECHO
    };

    nn_parse_options (&nn_cli, &options, argc, argv);
    sock = nn_create_socket (&options);
    nn_connect_socket (&options, sock);
    nn_sleep((int)(options.send_delay*1000));
    switch (options.socket_type) {
    case NN_PUB:
    case NN_PUSH:
        nn_send_loop (&options, sock);
        break;
    case NN_SUB:
    case NN_PULL:
        nn_recv_loop (&options, sock);
        break;
    case NN_BUS:
    case NN_PAIR:
        if (options.data_to_send.data) {
            nn_rw_loop (&options, sock);
        } else {
            nn_recv_loop (&options, sock);
        }
        break;
    case NN_SURVEYOR:
    case NN_REQ:
        nn_rw_loop (&options, sock);
        break;
    case NN_REP:
    case NN_RESPONDENT:
        if (options.data_to_send.data) {
            nn_resp_loop (&options, sock);
        } else {
            nn_recv_loop (&options, sock);
        }
        break;
    }

    nn_close (sock);
    nn_free_options(&nn_cli, &options);
    return 0;
}